

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O1

int raw_decode(opj_raw_t *raw)

{
  uint uVar1;
  
  if (raw->ct == 0) {
    raw->ct = 8;
    uVar1 = raw->len;
    if (uVar1 == raw->lenmax) {
      raw->c = 0xff;
    }
    else {
      if (raw->c == 0xff) {
        raw->ct = 7;
      }
      raw->c = raw->start[uVar1];
      raw->len = uVar1 + 1;
    }
  }
  uVar1 = raw->ct - 1;
  raw->ct = uVar1;
  return (int)((raw->c >> (uVar1 & 0x1f) & 1) != 0);
}

Assistant:

int raw_decode(opj_raw_t *raw) {
	int d;
	if (raw->ct == 0) {
		raw->ct = 8;
		if (raw->len == raw->lenmax) {
			raw->c = 0xff;
		} else {
			if (raw->c == 0xff) {
				raw->ct = 7;
			}
			raw->c = *(raw->start + raw->len);
			raw->len++;
		}
	}
	raw->ct--;
	d = (raw->c >> raw->ct) & 0x01;
	
	return d;
}